

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O1

void __thiscall QUndoView::setGroup(QUndoView *this,QUndoGroup *group)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  QUndoModel *this_00;
  undefined8 uVar4;
  QUndoStack *stack;
  QUndoGroup *pQVar5;
  char *pcVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QObject local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 0x5c0);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    pQVar5 = (QUndoGroup *)0x0;
  }
  else {
    pQVar5 = *(QUndoGroup **)(lVar1 + 0x5c8);
  }
  if (pQVar5 != group) {
    if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x5c8) != 0)) {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = *(QObject **)(lVar1 + 0x5c8);
      }
      QObject::disconnect(pQVar7,"2activeStackChanged(QUndoStack*)",*(QObject **)(lVar1 + 0x5d0),
                          "1setStack(QUndoStack*)");
    }
    if (group == (QUndoGroup *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)group);
    }
    piVar3 = *(int **)(lVar1 + 0x5c0);
    *(undefined8 *)(lVar1 + 0x5c0) = uVar4;
    *(QUndoGroup **)(lVar1 + 0x5c8) = group;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
    lVar2 = *(long *)(lVar1 + 0x5c0);
    if (((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) || (*(long *)(lVar1 + 0x5c8) == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QUndoModel::setStack(*(QUndoModel **)(lVar1 + 0x5d0),(QUndoStack *)0x0);
        return;
      }
      goto LAB_0066cde9;
    }
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = *(char **)(lVar1 + 0x5c8);
    }
    QObject::connect(local_20,pcVar6,(QObject *)"2activeStackChanged(QUndoStack*)",
                     *(char **)(lVar1 + 0x5d0),0x707a46);
    QMetaObject::Connection::~Connection((Connection *)local_20);
    this_00 = *(QUndoModel **)(lVar1 + 0x5d0);
    stack = (QUndoStack *)QUndoGroup::activeStack();
    QUndoModel::setStack(this_00,stack);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0066cde9:
  __stack_chk_fail();
}

Assistant:

void QUndoView::setGroup(QUndoGroup *group)
{
    Q_D(QUndoView);

    if (d->group == group)
        return;

    if (d->group != nullptr) {
        disconnect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
    }

    d->group = group;

    if (d->group != nullptr) {
        connect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
        d->model->setStack(d->group->activeStack());
    } else {
        d->model->setStack(nullptr);
    }
}